

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O2

bool __thiscall Assimp::ASE::Parser::SkipSection(Parser *this)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  uint uVar4;
  int iVar5;
  
  uVar4 = this->iLineNumber;
  iVar5 = 0;
  pbVar2 = (byte *)this->filePtr;
  do {
    pbVar3 = pbVar2 + 1;
    bVar1 = *pbVar2;
    if (bVar1 == 0x7d) {
      iVar5 = iVar5 + -1;
      if (iVar5 == 0) {
        this->filePtr = (char *)pbVar3;
        SkipToNextToken(this);
LAB_003e44da:
        return bVar1 == 0x7d;
      }
    }
    else if ((bVar1 - 0xc < 2) || (bVar1 == 10)) {
      uVar4 = uVar4 + 1;
      this->iLineNumber = uVar4;
    }
    else if (bVar1 == 0x7b) {
      iVar5 = iVar5 + 1;
    }
    else if (bVar1 == 0) {
      LogWarning(this,
                 "Unable to parse block: Unexpected EOF, closing bracket \'}\' was expected [#1]");
      goto LAB_003e44da;
    }
    this->filePtr = (char *)pbVar3;
    pbVar2 = pbVar3;
  } while( true );
}

Assistant:

bool Parser::SkipSection()
{
    // must handle subsections ...
    int iCnt = 0;
    while (true)
    {
        if ('}' == *filePtr)
        {
            --iCnt;
            if (0 == iCnt)
            {
                // go to the next valid token ...
                ++filePtr;
                SkipToNextToken();
                return true;
            }
        }
        else if ('{' == *filePtr)
        {
            ++iCnt;
        }
        else if ('\0' == *filePtr)
        {
            LogWarning("Unable to parse block: Unexpected EOF, closing bracket \'}\' was expected [#1]");
            return false;
        }
        else if(IsLineEnd(*filePtr))++iLineNumber;
        ++filePtr;
    }
}